

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.h
# Opt level: O2

void Assimp::ArrayBounds<aiVector3t<float>>
               (aiVector3t<float> *in,uint size,aiVector3t<float> *min,aiVector3t<float> *max)

{
  ulong uVar1;
  bool bVar2;
  aiVector3t<float> aVar3;
  
  max->x = -1e+10;
  max->y = -1e+10;
  max->z = -1e+10;
  min->x = 1e+10;
  min->y = 1e+10;
  min->z = 1e+10;
  uVar1 = (ulong)size;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    aVar3 = std::min<float>(in,min);
    *min = aVar3;
    aVar3 = std::max<float>(in,max);
    *max = aVar3;
    in = in + 1;
  }
  return;
}

Assistant:

inline void ArrayBounds(const T* in, unsigned int size, T& min, T& max)
{
    MinMaxChooser<T> ()(min,max);
    for (unsigned int i = 0; i < size;++i) {
        min = std::min(in[i],min);
        max = std::max(in[i],max);
    }
}